

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O2

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *container)

{
  pointer pbVar1;
  OneHotEncoder *this_00;
  StringVector *pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> element;
  string asStack_48 [32];
  
  this_00 = Specification::Model::_internal_mutable_onehotencoder
                      ((this->super_Model).m_spec.
                       super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  Specification::OneHotEncoder::clear_stringcategories(this_00);
  pbVar1 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (container->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::__cxx11::string::string(asStack_48,(string *)pbVar4);
    pSVar2 = Specification::OneHotEncoder::_internal_mutable_stringcategories(this_00);
    pbVar3 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Add(&pSVar2->vector_);
    std::__cxx11::string::_M_assign((string *)pbVar3);
    std::__cxx11::string::~string(asStack_48);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<std::string>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_stringcategories();
        
        for (auto element : container) {
            std::string *value = ohe->mutable_stringcategories()->add_vector();
            *value = element;
        }
        return Result();
    }